

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAppender.h
# Opt level: O1

int32_t __thiscall
aeron::concurrent::logbuffer::TermAppender::appendFragmentedMessage
          (TermAppender *this,HeaderWriter *header,AtomicBuffer *srcBuffer,index_t srcOffset,
          index_t length,index_t maxPayloadLength,
          on_reserved_value_supplier_t *reservedValueSupplier,int32_t activeTermId)

{
  ulong *puVar1;
  uint8_t *puVar2;
  length_t lVar3;
  AtomicBuffer *pAVar4;
  uint8_t *puVar5;
  AtomicBuffer *pAVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  size_t length_00;
  uint uVar10;
  undefined4 in_register_0000008c;
  int32_t iVar11;
  index_t iVar12;
  long lVar13;
  int32_t offset;
  int iVar14;
  int index;
  ulong uVar15;
  int local_78 [3];
  index_t local_6c;
  int local_68;
  uint local_64;
  int local_60;
  int local_5c;
  ulong local_58;
  HeaderWriter *local_50;
  long local_48;
  AtomicBuffer *local_40;
  undefined8 local_38;
  
  uVar10 = 0;
  if (0 < length % maxPayloadLength) {
    uVar10 = length % maxPayloadLength + 0x3fU & 0xffffffe0;
  }
  local_38 = CONCAT44(in_register_0000008c,maxPayloadLength);
  pAVar4 = this->m_tailBuffer;
  iVar14 = this->m_tailOffset;
  lVar13 = (long)(int)((maxPayloadLength + 0x20) * (length / maxPayloadLength) + uVar10);
  local_6c = srcOffset;
  local_50 = header;
  local_40 = srcBuffer;
  AtomicBuffer::boundsCheck(pAVar4,iVar14,8);
  LOCK();
  puVar1 = (ulong *)(pAVar4->m_buffer + iVar14);
  uVar15 = *puVar1;
  *puVar1 = *puVar1 + lVar13;
  UNLOCK();
  iVar14 = (int)uVar15;
  local_58 = uVar15 >> 0x20;
  lVar3 = this->m_termBuffer->m_length;
  checkTerm(activeTermId,(int32_t)(uVar15 >> 0x20));
  local_48 = lVar13 + (uVar15 & 0xffffffff);
  if ((int)lVar3 < local_48) {
    iVar11 = -2;
    if ((long)(uVar15 & 0xffffffff) < (long)(int)lVar3) {
      pAVar4 = this->m_termBuffer;
      AtomicBuffer::boundsCheck(pAVar4,iVar14,4);
      *(length_t *)(pAVar4->m_buffer + iVar14) = -(lVar3 - iVar14);
      local_78[0] = 0;
      local_78[1] = 0;
      puVar5 = pAVar4->m_buffer;
      puVar2 = puVar5 + (long)iVar14 + 4;
      puVar2[0] = '\0';
      puVar2[1] = 0xc0;
      puVar2[2] = '\x01';
      puVar2[3] = '\0';
      *(int *)(puVar5 + (long)iVar14 + 8) = iVar14;
      *(int32_t *)(puVar5 + (long)iVar14 + 0xc) = local_50->m_sessionId;
      *(int32_t *)(puVar5 + (long)iVar14 + 0x10) = local_50->m_streamId;
      *(int *)(puVar5 + (long)iVar14 + 0x14) = (int)local_58;
      AtomicBuffer::boundsCheck(pAVar4,iVar14 + 6,2);
      puVar2 = pAVar4->m_buffer;
      (puVar2 + (long)iVar14 + 6)[0] = '\0';
      (puVar2 + (long)iVar14 + 6)[1] = '\0';
      AtomicBuffer::boundsCheck(pAVar4,iVar14,4);
      *(length_t *)(pAVar4->m_buffer + iVar14) = lVar3 - iVar14;
    }
  }
  else {
    bVar7 = 0x80;
    iVar12 = length;
    do {
      iVar9 = (int)local_38;
      iVar14 = iVar9;
      if (iVar12 < iVar9) {
        iVar14 = iVar12;
      }
      bVar8 = bVar7 | 0x40;
      if (iVar9 < iVar12) {
        bVar8 = bVar7;
      }
      local_64 = (uint)bVar8;
      local_60 = iVar14 + 0x20;
      pAVar4 = this->m_termBuffer;
      index = (int)uVar15;
      AtomicBuffer::boundsCheck(pAVar4,index,4);
      *(int *)(pAVar4->m_buffer + index) = -0x20 - iVar14;
      local_78[0] = 0;
      local_78[1] = 0;
      puVar5 = pAVar4->m_buffer;
      puVar2 = puVar5 + (long)index + 4;
      puVar2[0] = '\0';
      puVar2[1] = 0xc0;
      puVar2[2] = '\x01';
      puVar2[3] = '\0';
      *(int *)(puVar5 + (long)index + 8) = index;
      *(int32_t *)(puVar5 + (long)index + 0xc) = local_50->m_sessionId;
      *(int32_t *)(puVar5 + (long)index + 0x10) = local_50->m_streamId;
      *(int *)(puVar5 + (long)index + 0x14) = (int)local_58;
      pAVar4 = this->m_termBuffer;
      length_00 = (size_t)iVar14;
      iVar9 = (length - iVar12) + local_6c;
      local_68 = iVar12;
      AtomicBuffer::boundsCheck(pAVar4,index + 0x20,length_00);
      pAVar6 = local_40;
      AtomicBuffer::boundsCheck(local_40,iVar9,length_00);
      memcpy(pAVar4->m_buffer + (long)index + 0x20,pAVar6->m_buffer + iVar9,length_00);
      pAVar4 = this->m_termBuffer;
      AtomicBuffer::boundsCheck(pAVar4,index + 5,1);
      iVar9 = local_60;
      pAVar4->m_buffer[(long)index + 5] = (uint8_t)local_64;
      local_78[0] = index;
      local_5c = local_60;
      if ((reservedValueSupplier->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      lVar13 = (*reservedValueSupplier->_M_invoker)
                         ((_Any_data *)reservedValueSupplier,this->m_termBuffer,local_78,&local_5c);
      pAVar4 = this->m_termBuffer;
      AtomicBuffer::boundsCheck(pAVar4,index + 0x18,8);
      *(long *)(pAVar4->m_buffer + (long)index + 0x18) = lVar13;
      pAVar4 = this->m_termBuffer;
      AtomicBuffer::boundsCheck(pAVar4,index,4);
      *(int *)(pAVar4->m_buffer + index) = iVar9;
      uVar15 = (ulong)((iVar14 + 0x3fU & 0xffffffe0) + index);
      bVar7 = 0;
      iVar12 = local_68 - iVar14;
    } while (iVar12 != 0 && iVar14 <= local_68);
    iVar11 = (int32_t)local_48;
  }
  return iVar11;
}

Assistant:

std::int32_t appendFragmentedMessage(
        const HeaderWriter& header,
        const AtomicBuffer& srcBuffer,
        util::index_t srcOffset,
        util::index_t length,
        util::index_t maxPayloadLength,
        const on_reserved_value_supplier_t& reservedValueSupplier,
        std::int32_t activeTermId)
    {
        const int numMaxPayloads = length / maxPayloadLength;
        const util::index_t remainingPayload = length % maxPayloadLength;
        const util::index_t lastFrameLength = (remainingPayload > 0) ?
            util::BitUtil::align(remainingPayload + DataFrameHeader::LENGTH, FrameDescriptor::FRAME_ALIGNMENT) : 0;
        const util::index_t requiredLength =
            (numMaxPayloads * (maxPayloadLength + DataFrameHeader::LENGTH)) + lastFrameLength;
        const std::int64_t rawTail = getAndAddRawTail(requiredLength);
        const std::int64_t termOffset = rawTail & 0xFFFFFFFF;
        const std::int32_t termId = LogBufferDescriptor::termId(rawTail);

        const std::int32_t termLength = m_termBuffer.capacity();

        checkTerm(activeTermId, termId);

        std::int64_t resultingOffset = termOffset + requiredLength;
        if (resultingOffset > termLength)
        {
            resultingOffset = handleEndOfLogCondition(m_termBuffer, termOffset, header, termLength, termId);
        }
        else
        {
            std::uint8_t flags = FrameDescriptor::BEGIN_FRAG;
            util::index_t remaining = length;
            std::int32_t frameOffset = static_cast<std::int32_t>(termOffset);

            do
            {
                const util::index_t bytesToWrite = std::min(remaining, maxPayloadLength);
                const util::index_t frameLength = bytesToWrite + DataFrameHeader::LENGTH;
                const util::index_t alignedLength =
                    util::BitUtil::align(frameLength, FrameDescriptor::FRAME_ALIGNMENT);

                header.write(m_termBuffer, frameOffset, frameLength, termId);
                m_termBuffer.putBytes(
                    frameOffset + DataFrameHeader::LENGTH,
                    srcBuffer,
                    srcOffset + (length - remaining),
                    bytesToWrite);

                if (remaining <= maxPayloadLength)
                {
                    flags |= FrameDescriptor::END_FRAG;
                }

                FrameDescriptor::frameFlags(m_termBuffer, frameOffset, flags);

                const std::int64_t reservedValue = reservedValueSupplier(m_termBuffer, frameOffset, frameLength);
                m_termBuffer.putInt64(frameOffset + DataFrameHeader::RESERVED_VALUE_FIELD_OFFSET, reservedValue);

                FrameDescriptor::frameLengthOrdered(m_termBuffer, frameOffset, frameLength);

                flags = 0;
                frameOffset += alignedLength;
                remaining -= bytesToWrite;
            }
            while (remaining > 0);
        }

        return static_cast<std::int32_t>(resultingOffset);
    }